

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void sarimatest(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *inp;
  sarima_object obj;
  undefined1 *puVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 local_25c8 [8];
  double temp [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    uVar3 = 0;
    if (iVar1 == 0) {
      puVar2 = local_25c8;
      uVar3 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",puVar2);
        iVar1 = feof(__stream);
        puVar2 = puVar2 + 8;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (iVar1 == 0);
    }
    inp = (double *)malloc(uVar3 * 8);
    if ((int)uVar3 != 0) {
      memcpy(inp,local_25c8,uVar3 << 3);
    }
    lVar4 = 0;
    obj = sarima_init(0,1,1,0xc,0,1,1,(int)uVar3);
    sarima_setMethod(obj,1);
    sarima_setCSSML(obj,0);
    sarima_exec(obj,inp);
    sarima_summary(obj);
    sarima_predict(obj,inp,5,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",xpred[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    putchar(10);
    lVar4 = 0;
    printf("Standard Errors  : ");
    do {
      dVar5 = amse[lVar4];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      printf("%g ",dVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    putchar(10);
    sarima_free(obj);
    free(inp);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void sarimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *phi, *theta;
	double *PHI, *THETA;
	double *xpred, *amse;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 1;
	Q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
	PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	//ifp = fopen("../data/itdaily.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = sarima_init(p, d, q,s,P,D,Q, N);
	sarima_setMethod(obj, 1); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	sarima_setCSSML(obj,0); // 0 - Only MLE , 1 - CSS + MLE
	//sarima_setOptMethod(obj, 7);// Method 5 ("BFGS") is default . The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	sarima_exec(obj, inp);
	sarima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
}